

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costEvaluation
          (L2NormCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  bool bVar1;
  double *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  char *in_XMM0_Qa;
  double controlCost;
  double stateCost;
  string *in_stack_00000648;
  double *in_stack_00000650;
  VectorDynSize *in_stack_00000658;
  double in_stack_00000660;
  CostAttributes *in_stack_00000668;
  allocator<char> *__a;
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  double local_40;
  double local_38;
  double *local_30;
  bool local_1;
  
  local_38 = 0.0;
  local_40 = 0.0;
  __a = *(allocator<char> **)(in_RDI + 0x28);
  local_30 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_XMM0_Qa,__a);
  bVar1 = CostAttributes::evaluateCost
                    (in_stack_00000668,in_stack_00000660,in_stack_00000658,in_stack_00000650,
                     in_stack_00000648);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_XMM0_Qa,__a);
    bVar1 = CostAttributes::evaluateCost
                      (in_stack_00000668,in_stack_00000660,in_stack_00000658,in_stack_00000650,
                       in_stack_00000648);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      *local_30 = local_38 + local_40;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool L2NormCost::costEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            double stateCost = 0, controlCost = 0;

            if (!m_pimpl->stateCost.evaluateCost(time, state, stateCost, "state"))
                return false;

            if (!m_pimpl->controlCost.evaluateCost(time, control, controlCost, "control"))
                return false;

            costValue = stateCost + controlCost;

            return true;
        }